

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyConcaveCollisionAlgorithm.cpp
# Opt level: O0

btScalar __thiscall
btSoftBodyConcaveCollisionAlgorithm::calculateTimeOfImpact
          (btSoftBodyConcaveCollisionAlgorithm *this,btCollisionObject *body0,
          btCollisionObject *body1,btDispatcherInfo *dispatchInfo,btManifoldResult *resultOut)

{
  bool bVar1;
  btTransform *pbVar2;
  btTransform *pbVar3;
  btVector3 *pbVar4;
  btCollisionShape *pbVar5;
  btCollisionObject *in_RDX;
  btCollisionObject *in_RSI;
  long in_RDI;
  btScalar bVar6;
  btScalar bVar7;
  btVector3 bVar8;
  btConcaveShape *triangleMesh;
  btCollisionObject *concavebody;
  LocalTriangleSphereCastCallback raycastCallback;
  btScalar curHitFraction;
  btScalar ccdRadius0;
  btVector3 rayAabbMax;
  btVector3 rayAabbMin;
  btTransform convexToLocal;
  btTransform convexFromLocal;
  btTransform triInv;
  btScalar squareMot0;
  btCollisionObject *triBody;
  btCollisionObject *convexbody;
  btVector3 *in_stack_fffffffffffffd38;
  btVector3 *in_stack_fffffffffffffd40;
  LocalTriangleSphereCastCallback *this_00;
  undefined4 in_stack_fffffffffffffd88;
  btCollisionObject *local_270;
  btCollisionObject *this_01;
  undefined1 local_230 [204];
  btScalar local_164;
  undefined4 local_160;
  btVector3 local_15c;
  undefined1 local_14c [20];
  btVector3 local_138;
  undefined1 local_128 [84];
  btTransform local_d4 [2];
  undefined8 local_54;
  undefined8 local_4c;
  btScalar local_44;
  btCollisionObject *local_40;
  btCollisionObject *local_38;
  btScalar local_4;
  
  this_01 = in_RSI;
  if ((*(byte *)(in_RDI + 0x10) & 1) != 0) {
    this_01 = in_RDX;
  }
  local_270 = in_RDX;
  if ((*(byte *)(in_RDI + 0x10) & 1) != 0) {
    local_270 = in_RSI;
  }
  local_40 = local_270;
  local_38 = this_01;
  pbVar2 = btCollisionObject::getInterpolationWorldTransform(this_01);
  pbVar2 = (btTransform *)btTransform::getOrigin(pbVar2);
  pbVar3 = btCollisionObject::getWorldTransform(local_38);
  btTransform::getOrigin(pbVar3);
  bVar8 = operator-(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  local_4c = bVar8.m_floats._8_8_;
  local_54 = bVar8.m_floats._0_8_;
  bVar6 = btVector3::length2((btVector3 *)0x28d1aa);
  local_44 = bVar6;
  bVar7 = btCollisionObject::getCcdSquareMotionThreshold(local_38);
  if (bVar7 <= bVar6) {
    btCollisionObject::getWorldTransform(local_40);
    btTransform::inverse((btTransform *)this_01);
    btCollisionObject::getWorldTransform(local_38);
    btTransform::operator*((btTransform *)CONCAT44(bVar6,in_stack_fffffffffffffd88),pbVar2);
    btCollisionObject::getInterpolationWorldTransform(local_38);
    btTransform::operator*((btTransform *)CONCAT44(bVar6,in_stack_fffffffffffffd88),pbVar2);
    btCollisionObject::getCollisionShape(local_40);
    bVar1 = btCollisionShape::isConcave((btCollisionShape *)0x28d26c);
    if (bVar1) {
      pbVar4 = btTransform::getOrigin(local_d4);
      local_128._0_8_ = *(undefined8 *)pbVar4->m_floats;
      local_128._8_8_ = *(undefined8 *)(pbVar4->m_floats + 2);
      btTransform::getOrigin((btTransform *)(local_128 + 0x14));
      pbVar2 = (btTransform *)local_128;
      btVector3::setMin((btVector3 *)pbVar2,in_stack_fffffffffffffd38);
      pbVar4 = btTransform::getOrigin(local_d4);
      local_138.m_floats._0_8_ = *(undefined8 *)pbVar4->m_floats;
      local_138.m_floats._8_8_ = *(undefined8 *)(pbVar4->m_floats + 2);
      btTransform::getOrigin((btTransform *)(local_128 + 0x14));
      btVector3::setMax((btVector3 *)pbVar2,in_stack_fffffffffffffd38);
      local_14c._16_4_ = btCollisionObject::getCcdSweptSphereRadius(local_38);
      pbVar3 = (btTransform *)local_14c;
      this_00 = (LocalTriangleSphereCastCallback *)(local_14c + 0x10);
      btVector3::btVector3
                ((btVector3 *)pbVar3,(btScalar *)this_00,(btScalar *)this_00,(btScalar *)this_00);
      btVector3::operator-=((btVector3 *)pbVar2,(btVector3 *)pbVar3);
      btVector3::btVector3(&local_15c,(btScalar *)this_00,(btScalar *)this_00,(btScalar *)this_00);
      btVector3::operator+=(&local_138,&local_15c);
      local_160 = 0x3f800000;
      btCollisionObject::getCcdSweptSphereRadius(local_38);
      calculateTimeOfImpact::LocalTriangleSphereCastCallback::LocalTriangleSphereCastCallback
                (this_00,pbVar3,pbVar2,(btScalar)((ulong)in_stack_fffffffffffffd38 >> 0x20),
                 SUB84(in_stack_fffffffffffffd38,0));
      local_164 = btCollisionObject::getHitFraction(local_38);
      pbVar5 = btCollisionObject::getCollisionShape(local_40);
      if (pbVar5 != (btCollisionShape *)0x0) {
        (*pbVar5->_vptr_btCollisionShape[0x10])(pbVar5,local_230,local_128,&local_138);
      }
      bVar6 = local_164;
      bVar7 = btCollisionObject::getHitFraction(local_38);
      if (bVar6 < bVar7) {
        btCollisionObject::setHitFraction(local_38,local_164);
        local_4 = local_164;
      }
      calculateTimeOfImpact::LocalTriangleSphereCastCallback::~LocalTriangleSphereCastCallback
                ((LocalTriangleSphereCastCallback *)0x28d4d5);
      if (bVar6 < bVar7) {
        return local_4;
      }
    }
  }
  return 1.0;
}

Assistant:

btScalar btSoftBodyConcaveCollisionAlgorithm::calculateTimeOfImpact(btCollisionObject* body0,btCollisionObject* body1,const btDispatcherInfo& dispatchInfo,btManifoldResult* resultOut)
{
	(void)resultOut;
	(void)dispatchInfo;
	btCollisionObject* convexbody = m_isSwapped ? body1 : body0;
	btCollisionObject* triBody = m_isSwapped ? body0 : body1;


	//quick approximation using raycast, todo: hook up to the continuous collision detection (one of the btConvexCast)

	//only perform CCD above a certain threshold, this prevents blocking on the long run
	//because object in a blocked ccd state (hitfraction<1) get their linear velocity halved each frame...
	btScalar squareMot0 = (convexbody->getInterpolationWorldTransform().getOrigin() - convexbody->getWorldTransform().getOrigin()).length2();
	if (squareMot0 < convexbody->getCcdSquareMotionThreshold())
	{
		return btScalar(1.);
	}

	//const btVector3& from = convexbody->m_worldTransform.getOrigin();
	//btVector3 to = convexbody->m_interpolationWorldTransform.getOrigin();
	//todo: only do if the motion exceeds the 'radius'

	btTransform triInv = triBody->getWorldTransform().inverse();
	btTransform convexFromLocal = triInv * convexbody->getWorldTransform();
	btTransform convexToLocal = triInv * convexbody->getInterpolationWorldTransform();

	struct LocalTriangleSphereCastCallback	: public btTriangleCallback
	{
		btTransform m_ccdSphereFromTrans;
		btTransform m_ccdSphereToTrans;
		btTransform	m_meshTransform;

		btScalar	m_ccdSphereRadius;
		btScalar	m_hitFraction;


		LocalTriangleSphereCastCallback(const btTransform& from,const btTransform& to,btScalar ccdSphereRadius,btScalar hitFraction)
			:m_ccdSphereFromTrans(from),
			m_ccdSphereToTrans(to),
			m_ccdSphereRadius(ccdSphereRadius),
			m_hitFraction(hitFraction)
		{			
		}


		virtual void processTriangle(btVector3* triangle, int partId, int triangleIndex)
		{
			(void)partId;
			(void)triangleIndex;
			//do a swept sphere for now
			btTransform ident;
			ident.setIdentity();
			btConvexCast::CastResult castResult;
			castResult.m_fraction = m_hitFraction;
			btSphereShape	pointShape(m_ccdSphereRadius);
			btTriangleShape	triShape(triangle[0],triangle[1],triangle[2]);
			btVoronoiSimplexSolver	simplexSolver;
			btSubsimplexConvexCast convexCaster(&pointShape,&triShape,&simplexSolver);
			//GjkConvexCast	convexCaster(&pointShape,convexShape,&simplexSolver);
			//ContinuousConvexCollision convexCaster(&pointShape,convexShape,&simplexSolver,0);
			//local space?

			if (convexCaster.calcTimeOfImpact(m_ccdSphereFromTrans,m_ccdSphereToTrans,
				ident,ident,castResult))
			{
				if (m_hitFraction > castResult.m_fraction)
					m_hitFraction = castResult.m_fraction;
			}

		}

	};





	if (triBody->getCollisionShape()->isConcave())
	{
		btVector3 rayAabbMin = convexFromLocal.getOrigin();
		rayAabbMin.setMin(convexToLocal.getOrigin());
		btVector3 rayAabbMax = convexFromLocal.getOrigin();
		rayAabbMax.setMax(convexToLocal.getOrigin());
		btScalar ccdRadius0 = convexbody->getCcdSweptSphereRadius();
		rayAabbMin -= btVector3(ccdRadius0,ccdRadius0,ccdRadius0);
		rayAabbMax += btVector3(ccdRadius0,ccdRadius0,ccdRadius0);

		btScalar curHitFraction = btScalar(1.); //is this available?
		LocalTriangleSphereCastCallback raycastCallback(convexFromLocal,convexToLocal,
			convexbody->getCcdSweptSphereRadius(),curHitFraction);

		raycastCallback.m_hitFraction = convexbody->getHitFraction();

		btCollisionObject* concavebody = triBody;

		btConcaveShape* triangleMesh = (btConcaveShape*) concavebody->getCollisionShape();

		if (triangleMesh)
		{
			triangleMesh->processAllTriangles(&raycastCallback,rayAabbMin,rayAabbMax);
		}



		if (raycastCallback.m_hitFraction < convexbody->getHitFraction())
		{
			convexbody->setHitFraction( raycastCallback.m_hitFraction);
			return raycastCallback.m_hitFraction;
		}
	}

	return btScalar(1.);

}